

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_trXX(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2,uint32_t tst,uint32_t sizes
                    )

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  target_ulong ptr;
  uint64_t uVar10;
  ulong uVar11;
  uint64_t ptr_00;
  ulong ptr_01;
  uintptr_t unaff_retaddr;
  long local_88;
  uint64_t *local_60;
  
  uVar5 = (ulong)((sizes & 2) == 0);
  local_88 = uVar5 + 1;
  uVar10 = env->regs[1];
  uVar11 = (env->psw).mask;
  iVar6 = (int)uVar11;
  if ((uVar11 >> 0x20 & 1) == 0) {
    uVar2 = 0x7fffffff;
    if (-1 < iVar6) {
      uVar2 = 0xffffff;
    }
    uVar10 = (uint64_t)((uint)uVar10 & uVar2);
    local_60 = env->regs + (int)r1;
    if (iVar6 < 0) {
      ptr_01 = (ulong)((uint)*local_60 & 0x7fffffff);
    }
    else {
      ptr_01 = (ulong)((uint)*local_60 & 0xffffff);
    }
  }
  else {
    local_60 = env->regs + (int)r1;
    ptr_01 = *local_60;
  }
  iVar9 = r1 + 1;
  uVar8 = env->regs[iVar9];
  uVar7 = (ulong)((uint)uVar8 & 0x7fffffff);
  ptr_00 = env->regs[(int)r2];
  if ((uVar11 & 0x100000000) == 0) {
    uVar8 = uVar7;
    if (iVar6 < 0) {
      ptr_00 = (uint64_t)((uint)ptr_00 & 0x7fffffff);
    }
    else {
      ptr_00 = (uint64_t)((uint)ptr_00 & 0xffffff);
    }
  }
  if (((sizes & 2) != 0) || (_Var1 = s390_has_feat(env->uc,S390_FEAT_ETF2_ENH), _Var1)) {
    if ((uVar8 & uVar5) != 0) goto LAB_00cb6dd5;
    uVar11 = uVar10 & 0xfffffffffffffff8;
  }
  else {
    if ((uVar8 & 1) != 0) {
LAB_00cb6dd5:
      tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
    }
    uVar11 = uVar10 & 0xfffffffffffff000;
    local_88 = 2;
  }
  uVar2 = sizes & 1;
  uVar5 = uVar8 + local_88 * -0x2000;
  iVar6 = 0x2000;
  do {
    if ((sizes & 2) == 0) {
      uVar3 = cpu_lduw_data_ra_s390x(env,ptr_00,unaff_retaddr);
    }
    else {
      uVar3 = cpu_ldub_data_ra_s390x(env,ptr_00,unaff_retaddr);
    }
    ptr = ((uVar3 & 0xffff) << ((byte)uVar2 ^ 1)) + uVar11;
    if (uVar2 == 0) {
      uVar4 = cpu_lduw_data_ra_s390x(env,ptr,unaff_retaddr);
      if ((uVar4 & 0xffff) == tst) {
LAB_00cb6d0b:
        uVar4 = 1;
        goto LAB_00cb6d1e;
      }
      cpu_stw_data_ra_s390x(env,ptr_01,uVar4 & 0xffff,unaff_retaddr);
    }
    else {
      uVar4 = cpu_ldub_data_ra_s390x(env,ptr,unaff_retaddr);
      if ((uVar4 & 0xffff) == tst) goto LAB_00cb6d0b;
      cpu_stb_data_ra_s390x(env,ptr_01,uVar4 & 0xffff,unaff_retaddr);
    }
    ptr_00 = ptr_00 + local_88;
    ptr_01 = ptr_01 + (2 - (ulong)uVar2);
    uVar8 = uVar8 - local_88;
    if (uVar8 == 0) {
      uVar4 = 0;
      uVar8 = 0;
      goto LAB_00cb6d1e;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  uVar4 = 3;
  uVar8 = uVar5;
LAB_00cb6d1e:
  uVar11 = (env->psw).mask;
  if ((uVar11 & 0x100000000) == 0) {
    if ((int)uVar11 < 0) {
      uVar2 = (uint)ptr_01 & 0x7fffffff;
      uVar11 = *local_60 & 0xffffffff00000000;
    }
    else {
      uVar11 = *local_60 & 0xffffffffff000000;
      uVar2 = (uint)ptr_01 & 0xffffff;
    }
    ptr_01 = uVar2 | uVar11;
  }
  *local_60 = ptr_01;
  if (((env->psw).mask & 0x100000000) == 0) {
    uVar8 = uVar8 & 0xffffffff | env->regs[iVar9] & 0xffffffff00000000;
  }
  env->regs[iVar9] = uVar8;
  uVar11 = (env->psw).mask;
  if ((uVar11 & 0x100000000) == 0) {
    if ((int)uVar11 < 0) {
      uVar2 = (uint)ptr_00 & 0x7fffffff;
      uVar11 = env->regs[(int)r2] & 0xffffffff00000000;
    }
    else {
      uVar11 = env->regs[(int)r2] & 0xffffffffff000000;
      uVar2 = (uint)ptr_00 & 0xffffff;
    }
    ptr_00 = uVar2 | uVar11;
  }
  env->regs[(int)r2] = ptr_00;
  return uVar4;
}

Assistant:

uint32_t HELPER(trXX)(CPUS390XState *env, uint32_t r1, uint32_t r2,
                      uint32_t tst, uint32_t sizes)
{
    uintptr_t ra = GETPC();
    int dsize = (sizes & 1) ? 1 : 2;
    int ssize = (sizes & 2) ? 1 : 2;
    uint64_t tbl = get_address(env, 1);
    uint64_t dst = get_address(env, r1);
    uint64_t len = get_length(env, r1 + 1);
    uint64_t src = get_address(env, r2);
    uint32_t cc = 3;
    int i;

    /* The lower address bits of TBL are ignored.  For TROO, TROT, it's
       the low 3 bits (double-word aligned).  For TRTO, TRTT, it's either
       the low 12 bits (4K, without ETF2-ENH) or 3 bits (with ETF2-ENH).  */
    if (ssize == 2 && !s390_has_feat(env->uc, S390_FEAT_ETF2_ENH)) {
        tbl &= -4096;
    } else {
        tbl &= -8;
    }

    check_alignment(env, len, ssize, ra);

    /* Lest we fail to service interrupts in a timely manner, */
    /* limit the amount of work we're willing to do.   */
    for (i = 0; i < 0x2000; i++) {
        uint16_t sval = cpu_ldusize_data_ra(env, src, ssize, ra);
        uint64_t tble = tbl + (sval * dsize);
        uint16_t dval = cpu_ldusize_data_ra(env, tble, dsize, ra);
        if (dval == tst) {
            cc = 1;
            break;
        }
        cpu_stsize_data_ra(env, dst, dval, dsize, ra);

        len -= ssize;
        src += ssize;
        dst += dsize;

        if (len == 0) {
            cc = 0;
            break;
        }
    }

    set_address(env, r1, dst);
    set_length(env, r1 + 1, len);
    set_address(env, r2, src);

    return cc;
}